

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O0

void setStickyMouseButtons(_GLFWwindow *window,int enabled)

{
  int local_18;
  int i;
  int enabled_local;
  _GLFWwindow *window_local;
  
  if ((uint)window->stickyMouseButtons != enabled) {
    if (enabled == 0) {
      for (local_18 = 0; local_18 < 8; local_18 = local_18 + 1) {
        if (window->mouseButtons[local_18] == '\x03') {
          window->mouseButtons[local_18] = '\0';
        }
      }
    }
    window->stickyMouseButtons = (GLboolean)enabled;
  }
  return;
}

Assistant:

static void setStickyMouseButtons(_GLFWwindow* window, int enabled)
{
    if (window->stickyMouseButtons == enabled)
        return;

    if (!enabled)
    {
        int i;

        // Release all sticky mouse buttons
        for (i = 0;  i <= GLFW_MOUSE_BUTTON_LAST;  i++)
        {
            if (window->mouseButtons[i] == _GLFW_STICK)
                window->mouseButtons[i] = GLFW_RELEASE;
        }
    }

    window->stickyMouseButtons = enabled;
}